

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_> *this)

{
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZSavable_0195fbd0;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
            (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>,&PTR_PTR_0195f1b0);
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZCompElWithMem_0195eea0;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01962610;
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem() : TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE() {
    //PrepareIntPtIndices();
}